

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_uncompressed.hpp
# Opt level: O2

idx_t duckdb::UncompressedStringStorage::StringAppendBase
                (BufferHandle *handle,ColumnSegment *segment,SegmentStatistics *stats,
                UnifiedVectorFormat *data,idx_t offset,idx_t count)

{
  ulong uVar1;
  atomic<unsigned_long> *paVar2;
  __int_type _Var3;
  sel_t *psVar4;
  ulong uVar5;
  bool bVar6;
  int iVar7;
  uint *puVar8;
  ulong uVar9;
  data_ptr_t pdVar10;
  BlockManager *this;
  idx_t iVar11;
  ulong uVar12;
  idx_t iVar13;
  uint uVar14;
  ulong __n;
  TemplatedValidityMask<unsigned_long> *this_00;
  idx_t row_idx;
  anon_union_16_2_67f50693_for_value *value;
  char *__src;
  idx_t iVar15;
  ulong uStack_c0;
  int32_t current_offset;
  TemplatedValidityMask<unsigned_long> *local_90;
  UnifiedVectorFormat *local_88;
  idx_t local_80;
  data_ptr_t local_78;
  idx_t local_70;
  BaseStatistics *local_68;
  idx_t local_60;
  BufferHandle *local_58;
  long local_50;
  ulong local_48;
  ulong local_40;
  block_id_t block;
  
  local_68 = &stats->statistics;
  puVar8 = (uint *)BufferHandle::Ptr(handle);
  local_78 = data->data;
  local_58 = handle;
  uVar9 = RemainingSpace(segment,handle);
  _Var3 = (segment->super_SegmentBase<duckdb::ColumnSegment>).count.
          super___atomic_base<unsigned_long>._M_i;
  this_00 = &(data->validity).super_TemplatedValidityMask<unsigned_long>;
  local_50 = offset * 4;
  local_60 = -_Var3;
  local_90 = this_00;
  local_88 = data;
  local_80 = count;
  local_70 = offset;
  for (iVar15 = 0; iVar13 = count, count != iVar15; iVar15 = iVar15 + 1) {
    psVar4 = data->sel->sel_vector;
    if (psVar4 == (sel_t *)0x0) {
      row_idx = local_70 + iVar15;
    }
    else {
      row_idx = (idx_t)*(uint *)((long)psVar4 + iVar15 * 4 + local_50);
    }
    iVar13 = iVar15;
    if (uVar9 < 4) break;
    uVar1 = uVar9 - 4;
    local_40 = uVar9;
    bVar6 = TemplatedValidityMask<unsigned_long>::RowIsValid(this_00,row_idx);
    if (bVar6) {
      pdVar10 = BufferHandle::Ptr(local_58);
      local_48 = (ulong)puVar8[1];
      __n = (ulong)*(uint *)(local_78 + row_idx * 0x10);
      this = ColumnSegment::GetBlockManager(segment);
      iVar11 = BlockManager::GetBlockSize(this);
      uVar5 = local_48;
      uVar12 = iVar11 >> 2 & 0xfffffffffffffff8;
      if (0xfff < uVar12) {
        uVar12 = 0x1000;
      }
      uStack_c0 = __n;
      if (uVar12 <= __n) {
        uStack_c0 = 0xc;
      }
      uVar9 = uVar1 - uStack_c0;
      if (uVar1 < uStack_c0) break;
      value = (anon_union_16_2_67f50693_for_value *)(local_78 + row_idx * 0x10);
      StringStats::Update(local_68,(string_t *)&value->pointer);
      count = local_80;
      if (__n < uVar12) {
        uVar14 = (int)uStack_c0 + *puVar8;
        *puVar8 = uVar14;
        if ((value->pointer).length < 0xd) {
          __src = (value->pointer).prefix;
        }
        else {
          __src = (value->pointer).ptr;
        }
        switchD_016b0717::default(pdVar10 + (uVar5 - uVar14),__src,__n);
        uVar14 = NumericCastImpl<int,_unsigned_int,_false>::Convert(*puVar8);
        puVar8[_Var3 + iVar15 + 2] = uVar14;
        data = local_88;
        this_00 = local_90;
      }
      else {
        WriteString(segment,(string_t)value->pointer,&block,&current_offset);
        uVar14 = *puVar8;
        *puVar8 = uVar14 + 0xc;
        uVar9 = local_40 - 0x10;
        *(block_id_t *)(pdVar10 + (uVar5 - (uVar14 + 0xc))) = block;
        *(int32_t *)((long)(pdVar10 + (uVar5 - (uVar14 + 0xc))) + 8) = current_offset;
        iVar7 = NumericCastImpl<int,_unsigned_int,_false>::Convert(*puVar8);
        puVar8[_Var3 + iVar15 + 2] = -iVar7;
        count = local_80;
        data = local_88;
        this_00 = local_90;
      }
    }
    else {
      uVar9 = uVar1;
      if (local_60 == iVar15) {
        puVar8[2] = 0;
      }
      else {
        puVar8[_Var3 + iVar15 + 2] = puVar8[_Var3 + iVar15 + 1];
      }
    }
  }
  LOCK();
  paVar2 = &(segment->super_SegmentBase<duckdb::ColumnSegment>).count;
  (paVar2->super___atomic_base<unsigned_long>)._M_i =
       (paVar2->super___atomic_base<unsigned_long>)._M_i + iVar13;
  UNLOCK();
  return iVar13;
}

Assistant:

static idx_t StringAppendBase(BufferHandle &handle, ColumnSegment &segment, SegmentStatistics &stats,
	                              UnifiedVectorFormat &data, idx_t offset, idx_t count) {
		D_ASSERT(segment.GetBlockOffset() == 0);
		auto handle_ptr = handle.Ptr();
		auto source_data = UnifiedVectorFormat::GetData<string_t>(data);
		auto result_data = reinterpret_cast<int32_t *>(handle_ptr + DICTIONARY_HEADER_SIZE);
		auto dictionary_size = reinterpret_cast<uint32_t *>(handle_ptr);
		auto dictionary_end = reinterpret_cast<uint32_t *>(handle_ptr + sizeof(uint32_t));

		idx_t remaining_space = RemainingSpace(segment, handle);
		auto base_count = segment.count.load();
		for (idx_t i = 0; i < count; i++) {
			auto source_idx = data.sel->get_index(offset + i);
			auto target_idx = base_count + i;
			if (remaining_space < sizeof(int32_t)) {
				// string index does not fit in the block at all
				segment.count += i;
				return i;
			}
			remaining_space -= sizeof(int32_t);
			if (!data.validity.RowIsValid(source_idx)) {
				// null value is stored as a copy of the last value, this is done to be able to efficiently do the
				// string_length calculation
				if (target_idx > 0) {
					result_data[target_idx] = result_data[target_idx - 1];
				} else {
					result_data[target_idx] = 0;
				}
				continue;
			}
			auto end = handle.Ptr() + *dictionary_end;

#ifdef DEBUG
			GetDictionary(segment, handle).Verify(segment.GetBlockManager().GetBlockSize());
#endif
			// Unknown string, continue
			// non-null value, check if we can fit it within the block
			idx_t string_length = source_data[source_idx].GetSize();

			// determine whether or not we have space in the block for this string
			bool use_overflow_block = false;
			idx_t required_space = string_length;
			if (DUCKDB_UNLIKELY(required_space >=
			                    StringUncompressed::GetStringBlockLimit(segment.GetBlockManager().GetBlockSize()))) {
				// string exceeds block limit, store in overflow block and only write a marker here
				required_space = BIG_STRING_MARKER_SIZE;
				use_overflow_block = true;
			}
			if (DUCKDB_UNLIKELY(required_space > remaining_space)) {
				// no space remaining: return how many tuples we ended up writing
				segment.count += i;
				return i;
			}

			// we have space: write the string
			UpdateStringStats(stats, source_data[source_idx]);

			if (DUCKDB_UNLIKELY(use_overflow_block)) {
				// write to overflow blocks
				block_id_t block;
				int32_t current_offset;
				// write the string into the current string block
				WriteString(segment, source_data[source_idx], block, current_offset);
				*dictionary_size += BIG_STRING_MARKER_SIZE;
				remaining_space -= BIG_STRING_MARKER_SIZE;
				auto dict_pos = end - *dictionary_size;

				// write a big string marker into the dictionary
				WriteStringMarker(dict_pos, block, current_offset);

				// place the dictionary offset into the set of vectors
				// note: for overflow strings we write negative value

				// dictionary_size is an uint32_t value, so we can cast up.
				D_ASSERT(NumericCast<idx_t>(*dictionary_size) <= segment.GetBlockManager().GetBlockSize());
				result_data[target_idx] = -NumericCast<int32_t>((*dictionary_size));
			} else {
				// string fits in block, append to dictionary and increment dictionary position
				D_ASSERT(string_length < NumericLimits<uint16_t>::Maximum());
				*dictionary_size += required_space;
				remaining_space -= required_space;
				auto dict_pos = end - *dictionary_size;
				// now write the actual string data into the dictionary
				memcpy(dict_pos, source_data[source_idx].GetData(), string_length);

				// dictionary_size is an uint32_t value, so we can cast up.
				D_ASSERT(NumericCast<idx_t>(*dictionary_size) <= segment.GetBlockManager().GetBlockSize());
				// Place the dictionary offset into the set of vectors.
				result_data[target_idx] = NumericCast<int32_t>(*dictionary_size);
			}
			D_ASSERT(RemainingSpace(segment, handle) <= segment.GetBlockManager().GetBlockSize());
#ifdef DEBUG
			GetDictionary(segment, handle).Verify(segment.GetBlockManager().GetBlockSize());
#endif
		}
		segment.count += count;
		return count;
	}